

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O2

void vera::texture(Texture *_texture,string *_uniform_name)

{
  Shader *pSVar1;
  int iVar2;
  int iVar3;
  string uniform_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  if (shaderPtr == (Shader *)0x0) {
    shaderPtr = getFillShader();
  }
  std::__cxx11::string::string((string *)&local_60,(string *)_uniform_name);
  if (_uniform_name->_M_string_length == 0) {
    toString<unsigned_long>(&local_40,&shaderPtr->textureIndex);
    std::operator+(&local_80,"u_tex",&local_40);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pSVar1 = shaderPtr;
  std::__cxx11::string::string((string *)&local_80,"USE_TEXTURE",(allocator *)&local_40);
  (*(pSVar1->super_HaveDefines)._vptr_HaveDefines[10])(pSVar1,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  Shader::setUniformTexture(shaderPtr,&local_60,_texture,shaderPtr->textureIndex);
  pSVar1 = shaderPtr;
  std::operator+(&local_80,&local_60,"Resolution");
  iVar2 = (*_texture->_vptr_Texture[0xc])(_texture);
  iVar3 = (*_texture->_vptr_Texture[0xd])(_texture);
  Shader::setUniform(pSVar1,&local_80,(float)iVar2,(float)iVar3);
  std::__cxx11::string::~string((string *)&local_80);
  shaderPtr->textureIndex = shaderPtr->textureIndex + 1;
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void texture(Texture* _texture, const std::string _uniform_name) {
    if (shaderPtr == nullptr)
        shaderPtr = getFillShader();
    
    std::string uniform_name = _uniform_name;
    if (_uniform_name.size() == 0)
        uniform_name = "u_tex" + toString(shaderPtr->textureIndex);
    shaderPtr->addDefine("USE_TEXTURE", uniform_name);
    shaderPtr->setUniformTexture(uniform_name, _texture, shaderPtr->textureIndex );
    shaderPtr->setUniform(uniform_name + "Resolution", (float)_texture->getWidth(), (float)_texture->getHeight());
    shaderPtr->textureIndex++;
}